

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightBounds * __thiscall
pbrt::SpotLight::Bounds(LightBounds *__return_storage_ptr__,SpotLight *this)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  float fVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 local_78 [16];
  
  auVar23 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3);
  FVar1 = (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,ZEXT816(0) << 0x40,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  fVar22 = (this->super_LightBase).renderFromLight.m.m[2][2];
  fVar19 = (this->super_LightBase).renderFromLight.m.m[2][3];
  FVar2 = (this->super_LightBase).renderFromLight.m.m[3][0];
  FVar3 = (this->super_LightBase).renderFromLight.m.m[3][1];
  FVar4 = (this->super_LightBase).renderFromLight.m.m[3][2];
  FVar5 = (this->super_LightBase).renderFromLight.m.m[3][3];
  auVar24 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar25._0_4_ = auVar24._0_4_ * 0.0;
  auVar25._4_4_ = auVar24._4_4_ * 0.0;
  auVar25._8_4_ = auVar24._8_4_ * 0.0;
  auVar25._12_4_ = auVar24._12_4_ * 0.0;
  auVar24 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar25 = vfmadd213ps_fma(auVar24,ZEXT816(0) << 0x40,auVar25);
  auVar24 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  auVar31._0_4_ = auVar24._0_4_ + auVar25._0_4_;
  auVar31._4_4_ = auVar24._4_4_ + auVar25._4_4_;
  auVar31._8_4_ = auVar24._8_4_ + auVar25._8_4_;
  auVar31._12_4_ = auVar24._12_4_ + auVar25._12_4_;
  fVar28 = fVar22 + auVar26._0_4_;
  auVar20._0_4_ = auVar31._0_4_ * auVar31._0_4_;
  auVar20._4_4_ = auVar31._4_4_ * auVar31._4_4_;
  auVar20._8_4_ = auVar31._8_4_ * auVar31._8_4_;
  auVar20._12_4_ = auVar31._12_4_ * auVar31._12_4_;
  auVar20 = vmovshdup_avx(auVar20);
  auVar20 = vfmadd231ss_fma(auVar20,auVar31,auVar31);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
  if (auVar20._0_4_ < 0.0) {
    fVar21 = sqrtf(auVar20._0_4_);
    auVar26 = ZEXT416((uint)auVar26._0_4_);
  }
  else {
    auVar20 = vsqrtss_avx(auVar20,auVar20);
    fVar21 = auVar20._0_4_;
  }
  fVar6 = this->scale;
  pfVar13 = (this->I).values.ptr;
  uVar18 = (this->I).values.nStored;
  if (1 < uVar18) {
    lVar14 = uVar18 * 4 + -4;
    pfVar16 = pfVar13;
    pfVar15 = pfVar13;
    do {
      pfVar15 = pfVar15 + 1;
      pfVar13 = pfVar15;
      if (*pfVar15 <= *pfVar16) {
        pfVar13 = pfVar16;
      }
      lVar14 = lVar14 + -4;
      pfVar16 = pfVar13;
    } while (lVar14 != 0);
  }
  auVar29 = ZEXT816(0) << 0x40;
  auVar20 = vmulss_avx512f(ZEXT416((uint)FVar3),auVar29);
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)FVar2),auVar29,auVar20);
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)FVar4),auVar29,auVar20);
  auVar20 = vaddss_avx512f(ZEXT416((uint)FVar5),auVar20);
  fVar27 = auVar20._0_4_;
  bVar12 = fVar27 == 1.0;
  uVar17 = 0xff;
  if (!bVar12) {
    uVar17 = 0;
  }
  uVar18 = (ulong)uVar17;
  if (NAN(fVar27)) {
    uVar18 = 0;
  }
  auVar23 = vinsertps_avx(auVar23,ZEXT416((uint)FVar1),0x10);
  auVar24 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar24,auVar25);
  auVar29._0_4_ = auVar23._0_4_ + auVar24._0_4_;
  auVar29._4_4_ = auVar23._4_4_ + auVar24._4_4_;
  auVar29._8_4_ = auVar23._8_4_ + auVar24._8_4_;
  auVar29._12_4_ = auVar23._12_4_ + auVar24._12_4_;
  auVar30._4_4_ = fVar27;
  auVar30._0_4_ = fVar27;
  auVar30._8_4_ = fVar27;
  auVar30._12_4_ = fVar27;
  auVar23 = vdivps_avx(auVar29,auVar30);
  bVar8 = (bool)((byte)uVar18 & 1);
  bVar9 = (bool)((byte)(uVar18 >> 1) & 1);
  bVar10 = (bool)((byte)(uVar18 >> 2) & 1);
  bVar11 = (bool)((byte)(uVar18 >> 3) & 1);
  local_78._4_4_ = (uint)bVar9 * (int)auVar29._4_4_ | (uint)!bVar9 * auVar23._4_4_;
  local_78._0_4_ = (uint)bVar8 * (int)auVar29._0_4_ | (uint)!bVar8 * auVar23._0_4_;
  local_78._8_4_ = (uint)bVar10 * (int)auVar29._8_4_ | (uint)!bVar10 * auVar23._8_4_;
  local_78._12_4_ = (uint)bVar11 * (int)auVar29._12_4_ | (uint)!bVar11 * auVar23._12_4_;
  auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar22),ZEXT816(0) << 0x20,auVar26);
  fVar19 = fVar19 + auVar23._0_4_;
  fVar19 = (float)((uint)bVar12 * (int)fVar19 + (uint)!bVar12 * (int)(fVar19 / fVar27));
  fVar28 = fVar28 / fVar21;
  auVar23._4_4_ = fVar21;
  auVar23._0_4_ = fVar21;
  auVar23._8_4_ = fVar21;
  auVar23._12_4_ = fVar21;
  auVar23 = vdivps_avx(auVar31,auVar23);
  fVar22 = *pfVar13;
  fVar21 = acosf(this->cosFalloffEnd);
  uVar7 = vmovlps_avx(local_78);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar7;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar7 >> 0x20);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar19;
  uVar7 = vmovlps_avx(local_78);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar7;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar7 >> 0x20);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar19;
  auVar24._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar24._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar24._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar24._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar24 = vmovshdup_avx(auVar24);
  auVar24 = vfmadd231ss_fma(auVar24,auVar23,auVar23);
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
  if (auVar24._0_4_ < 0.0) {
    fVar19 = sqrtf(auVar24._0_4_);
  }
  else {
    auVar24 = vsqrtss_avx(auVar24,auVar24);
    fVar19 = auVar24._0_4_;
  }
  auVar26._4_4_ = fVar19;
  auVar26._0_4_ = fVar19;
  auVar26._8_4_ = fVar19;
  auVar26._12_4_ = fVar19;
  auVar23 = vdivps_avx(auVar23,auVar26);
  uVar7 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar7;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar7 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = fVar28 / fVar19;
  __return_storage_ptr__->phi = fVar6 * fVar22 * 4.0 * 3.1415927;
  __return_storage_ptr__->theta_o = 0.0;
  __return_storage_ptr__->theta_e = fVar21;
  __return_storage_ptr__->cosTheta_o = 1.0;
  fVar22 = cosf(fVar21);
  __return_storage_ptr__->cosTheta_e = fVar22;
  __return_storage_ptr__->twoSided = false;
  return __return_storage_ptr__;
}

Assistant:

LightBounds SpotLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    // As in Phi()
#if 0
    Float phi = scale * I.MaxValue() * 2 * Pi * ((1 - cosFalloffStart) +
                                          (cosFalloffStart - cosFalloffEnd) / 2);
#else
    // cf. room-subsurf-from-kd.pbrt test: we sorta kinda actually want to
    // compute power as if it was an isotropic light source; the
    // LightBounds geometric terms give zero importance outside the spot
    // light's cone, so inside the cone, it doesn't matter if the overall
    // power is low; it's more accurate to effectively treat it as a point
    // light source.
    Float phi = scale * I.MaxValue() * 4 * Pi;
#endif

    return LightBounds(p, w, phi, 0.f, std::acos(cosFalloffEnd), false);
}